

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::KeyMatcher<iutest::detail::LeMatcher<int>_>::KeyMatcher
          (KeyMatcher<iutest::detail::LeMatcher<int>_> *this,
          KeyMatcher<iutest::detail::LeMatcher<int>_> *param_1)

{
  KeyMatcher<iutest::detail::LeMatcher<int>_> *param_1_local;
  KeyMatcher<iutest::detail::LeMatcher<int>_> *this_local;
  
  IMatcher::IMatcher(&this->super_IMatcher,&param_1->super_IMatcher);
  (this->super_IMatcher)._vptr_IMatcher = (_func_int **)&PTR__KeyMatcher_003373f8;
  this->m_expected = param_1->m_expected;
  return;
}

Assistant:

class KeyMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    explicit KeyMatcher(const T& expected) : m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual) const
    {
        if IUTEST_COND_LIKELY( CastToMatcher(m_expected)(actual.first) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Key: " << m_expected;
        return strm.str();
    }